

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  size_t __n;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  long lVar6;
  
  __n = s->_M_string_length;
  if (0x7f < (long)__n) {
LAB_001aeda2:
    puVar4 = WriteStringMaybeAliasedOutline(this,num,s,ptr);
    return puVar4;
  }
  uVar2 = num * 8;
  if (uVar2 < 0x80) {
    if ((long)(this->end_ + (0xe - (long)ptr)) < (long)__n) goto LAB_001aeda2;
  }
  else {
    lVar6 = 2;
    if ((0x3fff < uVar2) && (lVar6 = 3, 0x1fffff < uVar2)) {
      lVar6 = 5 - (ulong)(uVar2 < 0x10000000);
    }
    if ((long)(this->end_ + ~(ulong)(ptr + lVar6) + 0x10) < (long)__n) goto LAB_001aeda2;
    if (0x7f < uVar2) {
      *ptr = (byte)uVar2 | 0x82;
      if (uVar2 < 0x4000) {
        ptr[1] = (uint8)(uVar2 >> 7);
        puVar4 = ptr + 2;
      }
      else {
        puVar4 = ptr + 2;
        uVar2 = uVar2 >> 7;
        do {
          puVar5 = puVar4;
          puVar5[-1] = (byte)uVar2 | 0x80;
          uVar3 = uVar2 >> 7;
          puVar4 = puVar5 + 1;
          bVar1 = 0x3fff < uVar2;
          uVar2 = uVar3;
        } while (bVar1);
        *puVar5 = (uint8)uVar3;
      }
      goto LAB_001aed45;
    }
  }
  *ptr = (byte)uVar2 | 2;
  puVar4 = ptr + 1;
LAB_001aed45:
  *puVar4 = (uint8)__n;
  memcpy(puVar4 + 1,(s->_M_dataplus)._M_p,__n);
  return puVar4 + __n + 1;
}

Assistant:

uint8* WriteStringMaybeAliased(uint32 num, const std::string& s, uint8* ptr) {
    std::ptrdiff_t size = s.size();
    if (PROTOBUF_PREDICT_FALSE(
            size >= 128 || end_ - ptr + 16 - TagSize(num << 3) - 1 < size)) {
      return WriteStringMaybeAliasedOutline(num, s, ptr);
    }
    ptr = UnsafeVarint((num << 3) | 2, ptr);
    *ptr++ = static_cast<uint8>(size);
    std::memcpy(ptr, s.data(), size);
    return ptr + size;
  }